

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnWriteVer.c
# Opt level: O3

void Wln_WriteVerIntVec(FILE *pFile,Wln_Ntk_t *p,Vec_Int_t *vVec,int Start)

{
  char *__s;
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  
  if (0 < vVec->nSize) {
    uVar5 = 0;
    iVar4 = 0;
    iVar6 = Start;
    do {
      __s = Wln_ObjName(p,vVec->pArray[uVar5]);
      sVar1 = strlen(__s);
      iVar3 = (int)sVar1 + 2;
      if (iVar4 == 0) {
        iVar4 = 0;
      }
      else if (0x43 < iVar6 + iVar3) {
        fwrite("\n   ",4,1,(FILE *)pFile);
        iVar4 = 0;
        iVar6 = Start;
      }
      pcVar2 = ",";
      if (uVar5 == vVec->nSize - 1) {
        pcVar2 = "";
      }
      fprintf((FILE *)pFile," %s%s",__s,pcVar2);
      iVar6 = iVar6 + iVar3;
      iVar4 = iVar4 + 1;
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)vVec->nSize);
  }
  return;
}

Assistant:

void Wln_WriteVerIntVec( FILE * pFile, Wln_Ntk_t * p, Vec_Int_t * vVec, int Start )
{
    char * pName;
    int LineLength  = Start;
    int NameCounter = 0;
    int AddedLength, i, iObj;
    Vec_IntForEachEntry( vVec, iObj, i )
    {
        pName = Wln_ObjName( p, iObj );
        // get the line length after this name is written
        AddedLength = strlen(pName) + 2;
        if ( NameCounter && LineLength + AddedLength + 3 > 70 )
        { // write the line extender
            fprintf( pFile, "\n   " );
            // reset the line length
            LineLength  = Start;
            NameCounter = 0;
        }
        fprintf( pFile, " %s%s", pName, (i==Vec_IntSize(vVec)-1)? "" : "," );
        LineLength += AddedLength;
        NameCounter++;
    }
}